

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geoplg.cpp
# Opt level: O0

void * rw::destroyNativeData(void *object,int32 offset,int32 size)

{
  Geometry *geometry;
  int32 size_local;
  int32 offset_local;
  void *object_local;
  
  object_local = object;
  if (*(long *)((long)object + 0x98) != 0) {
    if (**(int **)((long)object + 0x98) == 4) {
      object_local = ps2::destroyNativeData(object,offset,size);
    }
    else if (**(int **)((long)object + 0x98) == 0xb) {
      object_local = wdgl::destroyNativeData(object,offset,size);
    }
    else if (**(int **)((long)object + 0x98) == 5) {
      object_local = xbox::destroyNativeData(object,offset,size);
    }
    else if (**(int **)((long)object + 0x98) == 8) {
      object_local = d3d8::destroyNativeData(object,offset,size);
    }
    else if (**(int **)((long)object + 0x98) == 9) {
      object_local = d3d9::destroyNativeData(object,offset,size);
    }
    else if (**(int **)((long)object + 0x98) == 0xc) {
      object_local = gl3::destroyNativeData(object,offset,size);
    }
  }
  return object_local;
}

Assistant:

static void*
destroyNativeData(void *object, int32 offset, int32 size)
{
	Geometry *geometry = (Geometry*)object;
	if(geometry->instData == nil)
		return object;
	if(geometry->instData->platform == PLATFORM_PS2)
		return ps2::destroyNativeData(object, offset, size);
	if(geometry->instData->platform == PLATFORM_WDGL)
		return wdgl::destroyNativeData(object, offset, size);
	if(geometry->instData->platform == PLATFORM_XBOX)
		return xbox::destroyNativeData(object, offset, size);
	if(geometry->instData->platform == PLATFORM_D3D8)
		return d3d8::destroyNativeData(object, offset, size);
	if(geometry->instData->platform == PLATFORM_D3D9)
		return d3d9::destroyNativeData(object, offset, size);
	if(geometry->instData->platform == PLATFORM_GL3)
		return gl3::destroyNativeData(object, offset, size);
	return object;
}